

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O2

bool __thiscall llvm::StringRef::getAsDouble(StringRef *this,double *Result,bool AllowInexact)

{
  opStatus oVar1;
  bool bVar2;
  double dVar3;
  APFloat F;
  undefined1 local_40 [32];
  
  APFloat::APFloat((APFloat *)local_40,0.0);
  oVar1 = APFloat::convertFromString((APFloat *)local_40,*this,rmNearestTiesToEven);
  if ((oVar1 == opOK) || (bVar2 = true, AllowInexact && (oVar1 & opInexact) != opOK)) {
    dVar3 = APFloat::convertToDouble((APFloat *)local_40);
    *Result = dVar3;
    bVar2 = false;
  }
  APFloat::Storage::~Storage((Storage *)(local_40 + 8));
  return bVar2;
}

Assistant:

bool StringRef::getAsDouble(double &Result, bool AllowInexact) const {
  APFloat F(0.0);
  APFloat::opStatus Status =
      F.convertFromString(*this, APFloat::rmNearestTiesToEven);
  if (Status != APFloat::opOK) {
    if (!AllowInexact || !(Status & APFloat::opInexact))
      return true;
  }

  Result = F.convertToDouble();
  return false;
}